

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ssize_t __thiscall google::LogSink::send(LogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t in_stack_00000008;
  tm *t_local;
  int line_local;
  char *base_filename_local;
  char *full_filename_local;
  LogSeverity severity_local;
  LogSink *this_local;
  
  return in_stack_00000008;
}

Assistant:

void LogSink::send(LogSeverity severity, const char* full_filename,
                   const char* base_filename, int line, const std::tm* t,
                   const char* message, size_t message_len) {
  (void)severity;
  (void)full_filename;
  (void)base_filename;
  (void)line;
  (void)t;
  (void)message;
  (void)message_len;
}